

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LatencyEncodingSynapse.cpp
# Opt level: O1

void __thiscall
LatencyEncodingSynapse::LatencyEncodingSynapse
          (LatencyEncodingSynapse *this,Population *n_from,Population *n_to)

{
  LatencyEncodingSynapse_param *pLVar1;
  
  (this->super_Synapse)._vptr_Synapse = (_func_int **)&PTR_update_00122d10;
  pLVar1 = (LatencyEncodingSynapse_param *)operator_new(8);
  pLVar1->window_length_s = 0.5;
  this->param = pLVar1;
  (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
       = (double *)0x0;
  (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
       = 0;
  (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  initialize(this,n_from,n_to);
  return;
}

Assistant:

LatencyEncodingSynapse::LatencyEncodingSynapse(Population* n_from, Population* n_to) : 
    param(new LatencyEncodingSynapse_param)
{
    initialize(n_from, n_to);
}